

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k051649.c
# Opt level: O0

void k051649_waveform_w(void *chip,UINT8 offset,UINT8 data)

{
  k051649_state *info;
  UINT8 data_local;
  UINT8 offset_local;
  void *chip_local;
  
  if (((*(byte *)((long)chip + 0x100) & 0x40) == 0) &&
     (((*(byte *)((long)chip + 0x100) & 0x80) == 0 || (offset < 0x60)))) {
    if (offset < 0x60) {
      *(UINT8 *)((long)chip +
                (long)(int)(offset & 0x1f) + (long)((int)(uint)offset >> 5) * 0x2c + 0x12) = data;
    }
    else {
      *(UINT8 *)((long)chip + (long)(int)(offset & 0x1f) + 0x96) = data;
      *(UINT8 *)((long)chip + (long)(int)(offset & 0x1f) + 0xc2) = data;
    }
  }
  return;
}

Assistant:

static void k051649_waveform_w(void *chip, UINT8 offset, UINT8 data)
{
	k051649_state *info = (k051649_state *)chip;
	
	// waveram is read-only?
	if (info->test & 0x40 || (info->test & 0x80 && offset >= 0x60))
		return;
	
	if (offset >= 0x60)
	{
		// channel 5 shares waveram with channel 4
		info->channel_list[3].waveram[offset&0x1f]=data;
		info->channel_list[4].waveram[offset&0x1f]=data;
	}
	else
		info->channel_list[offset>>5].waveram[offset&0x1f]=data;
}